

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O0

void C_DrawConsole(bool hw2d)

{
  DWORD DVar1;
  FFont *pFVar2;
  FFont *pFVar3;
  DFrameBuffer *pDVar4;
  bool bVar5;
  BYTE BVar6;
  uint scale;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  int32_t iVar15;
  FTexture *img;
  char *pcVar16;
  size_t sVar17;
  AActor *pAVar18;
  FBrokenLines **ppFVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  float fVar23;
  double local_1e8;
  undefined1 local_190 [8];
  FCommandBuffer command;
  FBrokenLines **p;
  int bottomline;
  FBrokenLines **printline;
  FBrokenLines **blines;
  uint consolelines;
  player_t *player;
  int tickbegin;
  int tickend;
  size_t i;
  char local_138 [4];
  int tickerY;
  char tickstr [256];
  FTexture *conpic;
  int visheight;
  int textScale;
  int offset;
  int left;
  int lines;
  bool hw2d_local;
  
  scale = active_con_scale();
  iVar7 = ConBottom / (int)scale;
  iVar8 = FFont::GetHeight(ConFont);
  iVar9 = FFont::GetHeight(ConFont);
  offset = (iVar7 + iVar8 * -2) / iVar9;
  iVar7 = FFont::GetHeight(ConFont);
  iVar8 = FFont::GetHeight(ConFont);
  iVar9 = ConBottom / (int)scale;
  iVar10 = FFont::GetHeight(ConFont);
  if (iVar9 - (iVar10 * 7) / 2 < offset * iVar8 - iVar7) {
    iVar7 = FFont::GetHeight(ConFont);
    visheight = -iVar7 / 2;
    offset = offset + -1;
  }
  else {
    iVar7 = FFont::GetHeight(ConFont);
    visheight = -iVar7;
  }
  if ((((ConBottom < C_DrawConsole::oldbottom) &&
       ((gamestate == GS_LEVEL || (gamestate == GS_TITLELEVEL)))) &&
      ((viewwindowx != 0 || (viewwindowy != 0)))) && ((viewactive & 1U) != 0)) {
    V_SetBorderNeedRefresh();
  }
  C_DrawConsole::oldbottom = ConBottom;
  if (ConsoleState == c_up) {
    FNotifyBuffer::Draw(&NotifyStrings);
  }
  else {
    if (ConBottom != 0) {
      img = FTextureManager::operator[](&TexMan,conback);
      pDVar4 = screen;
      iVar7 = ConBottom;
      iVar8 = DCanvas::GetHeight((DCanvas *)screen);
      uVar11 = DCanvas::GetWidth((DCanvas *)screen);
      uVar12 = DCanvas::GetHeight((DCanvas *)screen);
      DVar1 = conshade;
      if ((hw2d) && (gamestate != GS_FULLCONSOLE)) {
        fVar23 = FFloatCVar::operator_cast_to_float(&con_alpha);
        local_1e8 = (double)fVar23;
      }
      else {
        local_1e8 = 1.0;
      }
      DCanvas::DrawTexture
                ((DCanvas *)pDVar4,img,0.0,(double)(iVar7 - iVar8),0x40001389,local_1e8,
                 (ulong)uVar11,0x4000138a,(ulong)uVar12,0x400013aa,DVar1,0x4000138c,0x400013a5,0,0);
      if (((conline & 1U) != 0) &&
         (iVar8 = DCanvas::GetHeight((DCanvas *)screen), pDVar4 = screen, iVar7 < iVar8)) {
        uVar11 = DCanvas::GetWidth((DCanvas *)screen);
        (*(pDVar4->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])
                  (pDVar4,0,(ulong)(uint)iVar7,(ulong)uVar11,(ulong)(iVar7 + 1),0,0);
      }
      pDVar4 = screen;
      pFVar2 = ConFont;
      if (0xb < ConBottom) {
        if (scale == 1) {
          iVar7 = DCanvas::GetWidth((DCanvas *)screen);
          pFVar3 = ConFont;
          pcVar16 = GetVersionString();
          iVar8 = FFont::StringWidth(pFVar3,pcVar16);
          iVar9 = ConBottom / 1;
          iVar10 = FFont::GetHeight(ConFont);
          pcVar16 = GetVersionString();
          DCanvas::DrawText((DCanvas *)pDVar4,pFVar2,8,(iVar7 + -8) - iVar8,(iVar9 - iVar10) + -4,
                            pcVar16,0);
        }
        else {
          iVar7 = DCanvas::GetWidth((DCanvas *)screen);
          pFVar3 = ConFont;
          pcVar16 = GetVersionString();
          iVar8 = FFont::StringWidth(pFVar3,pcVar16);
          iVar9 = ConBottom / (int)scale;
          iVar10 = FFont::GetHeight(ConFont);
          pcVar16 = GetVersionString();
          iVar13 = DCanvas::GetWidth((DCanvas *)screen);
          iVar14 = DCanvas::GetHeight((DCanvas *)screen);
          DCanvas::DrawText((DCanvas *)pDVar4,pFVar2,8,(iVar7 / (int)scale + -8) - iVar8,
                            (iVar9 - iVar10) + -4,pcVar16,0x40001399,iVar13 / (int)scale,0x4000139a,
                            iVar14 / (int)scale,0x400013a8,1,0);
        }
        if (TickerMax == 0) {
          TickerVisible = false;
        }
        else {
          iVar7 = ConBottom / (int)scale;
          iVar8 = FFont::GetHeight(ConFont);
          i._4_4_ = (iVar7 - iVar8) + -4;
          uVar11 = ConCols / scale;
          iVar7 = DCanvas::GetWidth((DCanvas *)screen);
          player._4_4_ = (uVar11 - (int)((long)((ulong)(uint)((int)((long)iVar7 / (long)(int)scale)
                                                             >> 0x1f) << 0x20 |
                                               (long)iVar7 / (long)(int)scale & 0xffffffffU) / 0x5a)
                         ) + -6;
          player._0_4_ = 0;
          if (TickerLabel != (char *)0x0) {
            sVar17 = strlen(TickerLabel);
            player._0_4_ = (int)sVar17 + 2;
            mysnprintf(local_138,0x100,"%s: ",TickerLabel);
          }
          iVar7 = player._4_4_;
          iVar8 = (*ConFont->_vptr_FFont[3])(ConFont,0x12);
          if (0x100 - iVar8 < iVar7) {
            iVar7 = (*ConFont->_vptr_FFont[3])(ConFont,0x12);
            player._4_4_ = 0x100 - iVar7;
          }
          local_138[(int)player] = '\x10';
          memset(local_138 + (long)(int)player + 1,0x11,(long)(player._4_4_ - (int)player));
          local_138[player._4_4_ + 1] = '\x12';
          local_138[player._4_4_ + 2] = ' ';
          if ((TickerPercent & 1U) == 0) {
            local_138[player._4_4_ + 3] = '\0';
          }
          else {
            lVar20 = (long)player._4_4_;
            lVar21 = (long)player._4_4_;
            uVar11 = Scale(TickerAt,100,TickerMax);
            mysnprintf(local_138 + lVar20 + 3,0xfd - lVar21,"%d%%",(ulong)uVar11);
          }
          iVar7 = i._4_4_;
          pDVar4 = screen;
          pFVar2 = ConFont;
          if (scale == 1) {
            DCanvas::DrawText((DCanvas *)screen,ConFont,4,8,i._4_4_,local_138,0);
          }
          else {
            iVar8 = DCanvas::GetWidth((DCanvas *)screen);
            iVar9 = DCanvas::GetHeight((DCanvas *)screen);
            DCanvas::DrawText((DCanvas *)pDVar4,pFVar2,4,8,iVar7,local_138,0x40001399,
                              iVar8 / (int)scale,0x4000139a,iVar9 / (int)scale,0x400013a8,1,0);
          }
          iVar8 = (int)player * 8;
          iVar15 = Scale(TickerAt,(player._4_4_ - (int)player) * 8,TickerMax);
          iVar7 = i._4_4_;
          pDVar4 = screen;
          pFVar2 = ConFont;
          iVar8 = iVar8 + 0xd + iVar15;
          _tickbegin = (long)iVar8;
          if (scale == 1) {
            DCanvas::DrawChar((DCanvas *)screen,ConFont,8,iVar8,i._4_4_,'\x13',0);
          }
          else {
            iVar9 = DCanvas::GetWidth((DCanvas *)screen);
            iVar10 = DCanvas::GetHeight((DCanvas *)screen);
            DCanvas::DrawChar((DCanvas *)pDVar4,pFVar2,8,iVar8,iVar7,'\x13',0x40001399,
                              iVar9 / (int)scale,0x4000139a,iVar10 / (int)scale,0x400013a8,1,0);
          }
          TickerVisible = true;
        }
      }
      if ((StatusBar != (DBaseStatusBar *)0x0) && (!hw2d)) {
        _consolelines = StatusBar->CPlayer;
        bVar5 = TObjPtr<AActor>::operator!=(&_consolelines->camera,(AActor *)0x0);
        if ((bVar5) &&
           (pAVar18 = TObjPtr<AActor>::operator->(&_consolelines->camera),
           pAVar18->player != (player_t *)0x0)) {
          pAVar18 = TObjPtr<AActor>::operator->(&_consolelines->camera);
          _consolelines = pAVar18->player;
        }
        pDVar4 = screen;
        if (((_consolelines->BlendA != 0.0) || (NAN(_consolelines->BlendA))) &&
           ((gamestate == GS_LEVEL || (gamestate == GS_TITLELEVEL)))) {
          PalEntry::PalEntry((PalEntry *)((long)&blines + 4),
                             (BYTE)(int)(_consolelines->BlendR * 255.0),
                             (BYTE)(int)(_consolelines->BlendG * 255.0),
                             (BYTE)(int)(_consolelines->BlendB * 255.0));
          iVar7 = ConBottom;
          fVar23 = _consolelines->BlendA;
          uVar11 = DCanvas::GetWidth((DCanvas *)screen);
          iVar8 = DCanvas::GetHeight((DCanvas *)screen);
          (*(pDVar4->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xe])
                    ((ulong)(uint)fVar23,pDVar4,(ulong)blines._4_4_,0,(ulong)(uint)iVar7,
                     (ulong)uVar11,(ulong)(uint)(iVar8 - ConBottom));
          ST_SetNeedRefresh();
          V_SetBorderNeedRefresh();
        }
      }
    }
    if ((menuactive == MENU_Off) && (0 < offset)) {
      FConsoleBuffer::FormatText(conbuffer,ConFont,ConWidth / (int)scale);
      blines._0_4_ = FConsoleBuffer::GetFormattedLineCount(conbuffer);
      ppFVar19 = FConsoleBuffer::GetLines(conbuffer);
      uVar22 = (ulong)(uint)blines;
      lVar20 = (long)RowAdjust;
      iVar7 = ConBottom / (int)scale;
      iVar8 = FFont::GetHeight(ConFont);
      iVar7 = iVar7 + iVar8 * -2 + -4;
      ConsoleDrawing = true;
      for (command._8_8_ = ppFVar19 + uVar22 + (-1 - lVar20); pDVar4 = screen, pFVar2 = ConFont,
          ppFVar19 <= (ulong)command._8_8_ && 0 < offset; command._8_8_ = command._8_8_ + -8) {
        if (scale == 1) {
          iVar8 = FFont::GetHeight(ConFont);
          pcVar16 = FString::operator_cast_to_char_((FString *)(*(long *)command._8_8_ + 8));
          DCanvas::DrawText((DCanvas *)pDVar4,pFVar2,1,8,visheight + offset * iVar8,pcVar16,0);
        }
        else {
          iVar8 = FFont::GetHeight(ConFont);
          pcVar16 = FString::operator_cast_to_char_((FString *)(*(long *)command._8_8_ + 8));
          iVar9 = DCanvas::GetWidth((DCanvas *)screen);
          iVar10 = DCanvas::GetHeight((DCanvas *)screen);
          DCanvas::DrawText((DCanvas *)pDVar4,pFVar2,1,8,visheight + offset * iVar8,pcVar16,
                            0x40001399,iVar9 / (int)scale,0x4000139a,iVar10 / (int)scale,0x400013a8,
                            1,0);
        }
        offset = offset + -1;
      }
      ConsoleDrawing = false;
      if (0x13 < ConBottom) {
        if (gamestate != GS_STARTUP) {
          FCommandBuffer::FCommandBuffer((FCommandBuffer *)local_190,&CmdLine);
          FCommandBuffer::Draw((FCommandBuffer *)local_190,8,iVar7,scale,(bool)(cursoron & 1));
          FCommandBuffer::~FCommandBuffer((FCommandBuffer *)local_190);
        }
        iVar8 = ConBottom;
        if ((RowAdjust != 0) &&
           (iVar10 = FFont::GetHeight(ConFont), pDVar4 = screen, pFVar2 = ConFont, iVar9 = RowAdjust
           , (iVar10 * 7) / 2 <= iVar8)) {
          if (scale == 1) {
            iVar8 = FConsoleBuffer::GetFormattedLineCount(conbuffer);
            BVar6 = '\n';
            if (iVar9 == iVar8) {
              BVar6 = '\f';
            }
            DCanvas::DrawChar((DCanvas *)pDVar4,pFVar2,3,0,iVar7,BVar6,0);
          }
          else {
            iVar8 = FConsoleBuffer::GetFormattedLineCount(conbuffer);
            BVar6 = '\n';
            if (iVar9 == iVar8) {
              BVar6 = '\f';
            }
            iVar8 = DCanvas::GetWidth((DCanvas *)screen);
            iVar9 = DCanvas::GetHeight((DCanvas *)screen);
            DCanvas::DrawChar((DCanvas *)pDVar4,pFVar2,3,0,iVar7,BVar6,0x40001399,iVar8 / (int)scale
                              ,0x4000139a,iVar9 / (int)scale,0x400013a8,1,0);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void C_DrawConsole (bool hw2d)
{
	static int oldbottom = 0;
	int lines, left, offset;

	int textScale = active_con_scale();

	left = LEFTMARGIN;
	lines = (ConBottom/textScale-ConFont->GetHeight()*2)/ConFont->GetHeight();
	if (-ConFont->GetHeight() + lines*ConFont->GetHeight() > ConBottom/textScale - ConFont->GetHeight()*7/2)
	{
		offset = -ConFont->GetHeight()/2;
		lines--;
	}
	else
	{
		offset = -ConFont->GetHeight();
	}

	if ((ConBottom < oldbottom) &&
		(gamestate == GS_LEVEL || gamestate == GS_TITLELEVEL) &&
		(viewwindowx || viewwindowy) &&
		viewactive)
	{
		V_SetBorderNeedRefresh();
	}

	oldbottom = ConBottom;

	if (ConsoleState == c_up)
	{
		NotifyStrings.Draw();
		return;
	}
	else if (ConBottom)
	{
		int visheight;
		FTexture *conpic = TexMan[conback];

		visheight = ConBottom;

		screen->DrawTexture (conpic, 0, visheight - screen->GetHeight(),
			DTA_DestWidth, screen->GetWidth(),
			DTA_DestHeight, screen->GetHeight(),
			DTA_ColorOverlay, conshade,
			DTA_AlphaF, (hw2d && gamestate != GS_FULLCONSOLE) ? (double)con_alpha : 1.,
			DTA_Masked, false,
			TAG_DONE);
		if (conline && visheight < screen->GetHeight())
		{
			screen->Clear (0, visheight, screen->GetWidth(), visheight+1, 0, 0);
		}

		if (ConBottom >= 12)
		{
			if (textScale == 1)
				screen->DrawText (ConFont, CR_ORANGE, SCREENWIDTH - 8 -
					ConFont->StringWidth (GetVersionString()),
					ConBottom / textScale - ConFont->GetHeight() - 4,
					GetVersionString(), TAG_DONE);
			else
				screen->DrawText(ConFont, CR_ORANGE, SCREENWIDTH / textScale - 8 -
					ConFont->StringWidth(GetVersionString()),
					ConBottom / textScale - ConFont->GetHeight() - 4,
					GetVersionString(),
					DTA_VirtualWidth, screen->GetWidth() / textScale,
					DTA_VirtualHeight, screen->GetHeight() / textScale,
					DTA_KeepRatio, true, TAG_DONE);

			if (TickerMax)
			{
				char tickstr[256];
				const int tickerY = ConBottom / textScale - ConFont->GetHeight() - 4;
				size_t i;
				int tickend = ConCols / textScale - SCREENWIDTH / textScale / 90 - 6;
				int tickbegin = 0;

				if (TickerLabel)
				{
					tickbegin = (int)strlen (TickerLabel) + 2;
					mysnprintf (tickstr, countof(tickstr), "%s: ", TickerLabel);
				}
				if (tickend > 256 - ConFont->GetCharWidth(0x12))
					tickend = 256 - ConFont->GetCharWidth(0x12);
				tickstr[tickbegin] = 0x10;
				memset (tickstr + tickbegin + 1, 0x11, tickend - tickbegin);
				tickstr[tickend + 1] = 0x12;
				tickstr[tickend + 2] = ' ';
				if (TickerPercent)
				{
					mysnprintf (tickstr + tickend + 3, countof(tickstr) - tickend - 3,
						"%d%%", Scale (TickerAt, 100, TickerMax));
				}
				else
				{
					tickstr[tickend+3] = 0;
				}
				if (textScale == 1)
					screen->DrawText (ConFont, CR_BROWN, LEFTMARGIN, tickerY, tickstr, TAG_DONE);
				else
					screen->DrawText (ConFont, CR_BROWN, LEFTMARGIN, tickerY, tickstr,
						DTA_VirtualWidth, screen->GetWidth() / textScale,
						DTA_VirtualHeight, screen->GetHeight() / textScale,
						DTA_KeepRatio, true, TAG_DONE);

				// Draw the marker
				i = LEFTMARGIN+5+tickbegin*8 + Scale (TickerAt, (SDWORD)(tickend - tickbegin)*8, TickerMax);
				if (textScale == 1)
					screen->DrawChar (ConFont, CR_ORANGE, (int)i, tickerY, 0x13, TAG_DONE);
				else
					screen->DrawChar(ConFont, CR_ORANGE, (int)i, tickerY, 0x13,
						DTA_VirtualWidth, screen->GetWidth() / textScale,
						DTA_VirtualHeight, screen->GetHeight() / textScale,
						DTA_KeepRatio, true, TAG_DONE);

				TickerVisible = true;
			}
			else
			{
				TickerVisible = false;
			}
		}

		// Apply palette blend effects
		if (StatusBar != NULL && !hw2d)
		{
			player_t *player = StatusBar->CPlayer;
			if (player->camera != NULL && player->camera->player != NULL)
			{
				player = player->camera->player;
			}
			if (player->BlendA != 0 && (gamestate == GS_LEVEL || gamestate == GS_TITLELEVEL))
			{
				screen->Dim (PalEntry ((unsigned char)(player->BlendR*255), (unsigned char)(player->BlendG*255), (unsigned char)(player->BlendB*255)),
					player->BlendA, 0, ConBottom, screen->GetWidth(), screen->GetHeight() - ConBottom);
				ST_SetNeedRefresh();
				V_SetBorderNeedRefresh();
			}
		}
	}

	if (menuactive != MENU_Off)
	{
		return;
	}

	if (lines > 0)
	{
		// No more enqueuing because adding new text to the console won't touch the actual print data.
		conbuffer->FormatText(ConFont, ConWidth / textScale);
		unsigned int consolelines = conbuffer->GetFormattedLineCount();
		FBrokenLines **blines = conbuffer->GetLines();
		FBrokenLines **printline = blines + consolelines - 1 - RowAdjust;

		int bottomline = ConBottom / textScale - ConFont->GetHeight()*2 - 4;

		ConsoleDrawing = true;

		for(FBrokenLines **p = printline; p >= blines && lines > 0; p--, lines--)
		{
			if (textScale == 1)
			{
				screen->DrawText(ConFont, CR_TAN, LEFTMARGIN, offset + lines * ConFont->GetHeight(), (*p)->Text, TAG_DONE);
			}
			else
			{
				screen->DrawText(ConFont, CR_TAN, LEFTMARGIN, offset + lines * ConFont->GetHeight(), (*p)->Text,
					DTA_VirtualWidth, screen->GetWidth() / textScale,
					DTA_VirtualHeight, screen->GetHeight() / textScale,
					DTA_KeepRatio, true, TAG_DONE);
			}
		}

		ConsoleDrawing = false;

		if (ConBottom >= 20)
		{
			if (gamestate != GS_STARTUP)
			{
				// Make a copy of the command line, in case an input event is handled
				// while we draw the console and it changes.
				FCommandBuffer command(CmdLine);
				command.Draw(left, bottomline, textScale, cursoron);
			}
			if (RowAdjust && ConBottom >= ConFont->GetHeight()*7/2)
			{
				// Indicate that the view has been scrolled up (10)
				// and if we can scroll no further (12)
				if (textScale == 1)
					screen->DrawChar (ConFont, CR_GREEN, 0, bottomline, RowAdjust == conbuffer->GetFormattedLineCount() ? 12 : 10, TAG_DONE);
				else
					screen->DrawChar(ConFont, CR_GREEN, 0, bottomline, RowAdjust == conbuffer->GetFormattedLineCount() ? 12 : 10,
						DTA_VirtualWidth, screen->GetWidth() / textScale,
						DTA_VirtualHeight, screen->GetHeight() / textScale,
						DTA_KeepRatio, true, TAG_DONE);
			}
		}
	}
}